

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O0

obb * __thiscall
masc::polygon::bbox2d::build(obb *__return_storage_ptr__,bbox2d *this,bbox2d_problem *problem)

{
  double other;
  size_type sVar1;
  reference pvVar2;
  double *pdVar3;
  ulong uVar4;
  obb *poVar5;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  Point<double,_2> local_2c0;
  undefined1 local_2b0 [8];
  Vector2d nev;
  undefined1 local_298 [4];
  int ne;
  obb box;
  int i_1;
  char svg_filename [256];
  Point<double,_2> local_140;
  double local_130;
  double dn;
  double local_118;
  double dv;
  value_type *pt;
  int i;
  float max_n;
  float min_v;
  float max_v;
  Vector2d v0;
  double local_e0;
  double local_d8;
  Point<double,_2> local_d0;
  Vector<double,_2> local_c0;
  int local_b0;
  int local_ac;
  int hullsize;
  int w;
  float a [4];
  int e [4];
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  undefined1 local_60 [8];
  Vector2d n;
  double local_48;
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  Vector2d v;
  bbox2d_problem *problem_local;
  bbox2d *this_local;
  
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  n.v[1] = 0.0;
  v.v[1] = (double)problem;
  mathtool::Vector<double,_2>::Vector
            ((Vector<double,_2> *)local_30,&local_38,&local_40,&local_48,n.v + 1);
  local_68 = 0.0;
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = 0.0;
  mathtool::Vector<double,_2>::Vector
            ((Vector<double,_2> *)local_60,&local_68,&local_70,&local_78,&local_80);
  sVar1 = std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
          size(&this->m_chull);
  local_b0 = (int)sVar1;
  a[2] = 0.0;
  pvVar2 = std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
           operator[](&this->m_chull,1);
  std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::operator[]
            (&this->m_chull,0);
  mathtool::Point<double,_2>::operator-(&local_d0,pvVar2);
  mathtool::Vector<double,_2>::normalize(&local_c0);
  mathtool::Vector<double,_2>::operator=((Vector<double,_2> *)local_30,&local_c0);
  pdVar3 = mathtool::Vector<double,_2>::operator[]((Vector<double,_2> *)local_30,1);
  local_d8 = -*pdVar3;
  pdVar3 = mathtool::Vector<double,_2>::operator[]((Vector<double,_2> *)local_30,0);
  local_e0 = 0.0;
  v0.v[1] = 0.0;
  mathtool::Vector<double,_2>::set
            ((Vector<double,_2> *)local_60,&local_d8,pdVar3,&local_e0,v0.v + 1);
  mathtool::Vector<double,_2>::Vector((Vector<double,_2> *)&min_v,(Vector<double,_2> *)local_30);
  max_n = -3.4028235e+38;
  i = 0x7f7fffff;
  pt._4_4_ = -3.4028235e+38;
  for (pt._0_4_ = 2.8026e-45; (int)pt._0_4_ < local_b0; pt._0_4_ = (float)((int)pt._0_4_ + 1)) {
    pvVar2 = std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
             operator[](&this->m_chull,(long)(int)pt._0_4_);
    dv = (double)pvVar2;
    std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
    operator[](&this->m_chull,0);
    mathtool::Point<double,_2>::operator-((Point<double,_2> *)&dn,pvVar2);
    local_118 = mathtool::Vector<double,_2>::operator*
                          ((Vector<double,_2> *)&dn,(Vector<double,_2> *)local_30);
    other = dv;
    std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
    operator[](&this->m_chull,0);
    mathtool::Point<double,_2>::operator-(&local_140,(Point<double,_2> *)other);
    local_130 = mathtool::Vector<double,_2>::operator*
                          ((Vector<double,_2> *)&local_140,(Vector<double,_2> *)local_60);
    if ((double)max_n < local_118) {
      max_n = (float)local_118;
      a[3] = pt._0_4_;
    }
    if (local_118 < (double)(float)i) {
      i = (int)(float)local_118;
    }
    if ((double)pt._4_4_ < local_130) {
      pt._4_4_ = (float)local_130;
    }
  }
  local_ac = findAngles(this,(int *)(a + 2),(float *)&hullsize,(Vector2d *)local_30,
                        (Vector2d *)local_60);
  for (box.height = 0.0; uVar4 = (ulong)(int)box.height,
      sVar1 = std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
              ::size(&this->m_chull), uVar4 < sVar1; box.height = (float)((int)box.height + 1)) {
    createOBB((obb *)local_298,this,(int *)(a + 2),(Vector2d *)local_30,(Vector2d *)local_60);
    uVar4 = (*(code *)**(undefined8 **)v.v[1])(v.v[1],local_298);
    if ((uVar4 & 1) != 0) break;
    nev.v[1]._4_4_ = (float)(((int)a[(long)local_ac + 2] + 1) % local_b0);
    pvVar2 = std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
             operator[](&this->m_chull,(long)(int)nev.v[1]._4_4_);
    std::vector<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>::
    operator[](&this->m_chull,(long)(int)a[(long)local_ac + 2]);
    mathtool::Point<double,_2>::operator-(&local_2c0,pvVar2);
    mathtool::Vector<double,_2>::normalize((Vector<double,_2> *)local_2b0);
    if ((local_ac == 0) || (local_ac == 2)) {
      mathtool::Vector<double,_2>::operator=
                ((Vector<double,_2> *)local_30,(Vector<double,_2> *)local_2b0);
      pdVar3 = mathtool::Vector<double,_2>::operator[]((Vector<double,_2> *)local_30,1);
      local_2c8 = -*pdVar3;
      pdVar3 = mathtool::Vector<double,_2>::operator[]((Vector<double,_2> *)local_30,0);
      local_2d0 = 0.0;
      local_2d8 = 0.0;
      mathtool::Vector<double,_2>::set
                ((Vector<double,_2> *)local_60,&local_2c8,pdVar3,&local_2d0,&local_2d8);
    }
    else {
      mathtool::Vector<double,_2>::operator=
                ((Vector<double,_2> *)local_60,(Vector<double,_2> *)local_2b0);
      pdVar3 = mathtool::Vector<double,_2>::operator[]((Vector<double,_2> *)local_60,1);
      local_2e0 = -*pdVar3;
      pdVar3 = mathtool::Vector<double,_2>::operator[]((Vector<double,_2> *)local_60,0);
      local_2e8 = 0.0;
      local_2f0 = 0.0;
      mathtool::Vector<double,_2>::set
                ((Vector<double,_2> *)local_30,&local_2e0,pdVar3,&local_2e8,&local_2f0);
    }
    a[(long)local_ac + 2] = nev.v[1]._4_4_;
    local_ac = findAngles(this,(int *)(a + 2),(float *)&hullsize,(Vector2d *)local_30,
                          (Vector2d *)local_60);
  }
  poVar5 = bbox2d_problem::getSolution((bbox2d_problem *)v.v[1]);
  obb::obb(__return_storage_ptr__,poVar5);
  return __return_storage_ptr__;
}

Assistant:

obb bbox2d::build(bbox2d_problem & problem)
{
  mathtool::Vector2d v,n;
  int e[4]; //vertex indices of extreme points
  float a[4]; //angles
  int w; //index (0~3), so that e[w] has the smallest value a[w]
  int hullsize=m_chull.size();

  //init extreme points
  e[0]=0;
  v=(m_chull[1]-m_chull[0]).normalize();
  n.set(-v[1],v[0]);
  const mathtool::Vector2d v0=v;

  float max_v=-FLT_MAX, min_v=FLT_MAX, max_n=-FLT_MAX;
  for(int i=2;i<hullsize;i++)
  {
    auto& pt=m_chull[i];
    double dv=(pt-m_chull[0])*v;
    double dn=(pt-m_chull[0])*n;
    if(dv>max_v){ max_v=dv; e[1]=i;}
    if(dv<min_v){ min_v=dv; e[3]=i;}
    if(dn>max_n){ max_n=dn; e[2]=i;}
  }
  w=findAngles(e,a,v,n);

  //update extreme points
  char svg_filename[256];

  for(int i=0;i<m_chull.size();i++)
  {
    //create a box from v,n,e[4]
    obb box=createOBB(e,v,n);

#if DEBUG
    cout<<"box="<<box<<endl;
    sprintf(svg_filename, "%s%03d.svg", "DEBUG_",i);
    saveSVG(svg_filename,m_chull_ply,box);
    //saveSVG(svg_filename,m_ply.front(),box);
#endif

    //check if this box solve the problem
    if(problem.solved(box)) break;

    //update
    int ne=(e[w]+1)%hullsize;
    mathtool::Vector2d nev=(m_chull[ne]-m_chull[e[w]]).normalize();
    if(w==0 || w==2)
    {
      v=nev;
      n.set(-v[1],v[0]);
    }
    else{
      n=nev;
      v.set(-n[1],n[0]);
    }
    e[w]=ne;

    w=findAngles(e,a,v,n);
  }

  return problem.getSolution(); //done
}